

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

iovec * __thiscall mpt::value::vector(value *this,type_t to)

{
  ulong uVar1;
  iovec *piVar2;
  iovec *piVar3;
  uint uVar4;
  
  uVar1 = this->_type;
  if ((uVar1 != 0) && (piVar3 = (iovec *)this->_addr, piVar3 != (iovec *)0x0)) {
    if (to != 0) {
      uVar4 = (int)to + 0xe0U & 0xff;
      piVar2 = (iovec *)0x0;
      if (uVar1 != uVar4) {
        piVar3 = piVar2;
      }
      if (uVar4 == 0) {
        piVar3 = piVar2;
      }
      if (to - 0x7b < 0xffffffffffffffe5) {
        piVar3 = piVar2;
      }
      return piVar3;
    }
    piVar2 = (iovec *)0x0;
    if (uVar1 - 0x40 < 0x1a) {
      piVar2 = piVar3;
    }
    return piVar2;
  }
  return (iovec *)0x0;
}

Assistant:

const struct iovec *value::vector(type_t to) const
{
	if (!_type || !_addr) {
		return 0;
	}
	const struct iovec *vec = reinterpret_cast<const struct iovec *>(_addr);
	// accept all vector types
	if (!to) {
		return MPT_type_isVector(_type) ? vec : 0;
	}
	type_t type = MPT_type_toVector(to);
	if (!type) {
		return 0;
	}
	// content must match specific type
	return (_type == type) ? vec : 0;
}